

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

void __thiscall
ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::Append
          (ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> *this,ON_SubDLimitMeshSealEdgeInfo *x)

{
  ON_SubDLimitMeshSealEdgeInfo *pOVar1;
  int iVar2;
  ON_SubDMeshFragment *pOVar3;
  uchar uVar4;
  uchar uVar5;
  unsigned_short uVar6;
  ON_SubDLimitMeshSealEdgeInfo *memblock;
  int iVar7;
  uint uVar8;
  
  iVar2 = this->m_count;
  memblock = x;
  if (iVar2 == this->m_capacity) {
    if (iVar2 < 8 || (ulong)((long)iVar2 << 4) < 0x10000001) {
      uVar8 = 4;
      if (2 < iVar2) {
        uVar8 = iVar2 * 2;
      }
    }
    else {
      iVar7 = 0x1000008;
      if (iVar2 < 0x1000008) {
        iVar7 = iVar2;
      }
      uVar8 = iVar7 + iVar2;
    }
    if (x < this->m_a + this->m_capacity && this->m_a <= x) {
      memblock = (ON_SubDLimitMeshSealEdgeInfo *)onmalloc(0x10);
      uVar4 = x->m_bits;
      uVar5 = x->m_grid_side_dex;
      uVar6 = x->m_face_edge_count;
      pOVar3 = x->m_fragment;
      memblock->m_edge_id = x->m_edge_id;
      memblock->m_bits = uVar4;
      memblock->m_grid_side_dex = uVar5;
      memblock->m_face_edge_count = uVar6;
      memblock->m_fragment = pOVar3;
    }
    if ((uint)this->m_capacity < uVar8) {
      SetCapacity(this,(long)(int)uVar8);
    }
    if (this->m_a == (ON_SubDLimitMeshSealEdgeInfo *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
  }
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  uVar4 = memblock->m_bits;
  uVar5 = memblock->m_grid_side_dex;
  uVar6 = memblock->m_face_edge_count;
  pOVar3 = memblock->m_fragment;
  pOVar1 = this->m_a + iVar2;
  pOVar1->m_edge_id = memblock->m_edge_id;
  pOVar1->m_bits = uVar4;
  pOVar1->m_grid_side_dex = uVar5;
  pOVar1->m_face_edge_count = uVar6;
  pOVar1->m_fragment = pOVar3;
  if (memblock == x) {
    return;
  }
  onfree(memblock);
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}